

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O1

bool __thiscall
MADPComponentDiscreteStates::SetInitialized(MADPComponentDiscreteStates *this,bool b)

{
  double dVar1;
  double *pdVar2;
  bool bVar3;
  E *this_00;
  double *pdVar4;
  undefined7 in_register_00000031;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
LAB_0047ae05:
    this->_m_initialized = b;
    return b;
  }
  if (this->_m_nrStates == 0) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"MADPComponentDiscreteStates::SetInitialized problem has 0 states");
  }
  else {
    pdVar4 = (this->_m_initialStateDistribution->super_SDV).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar2 = (this->_m_initialStateDistribution->super_SDV).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    if (pdVar4 == pdVar2) {
      auVar6 = ZEXT816(0);
      bVar3 = true;
    }
    else {
      bVar3 = true;
      dVar5 = 0.0;
      do {
        dVar1 = *pdVar4;
        if (dVar1 < 0.0) {
          bVar3 = false;
        }
        if (1.0 < dVar1) {
          bVar3 = false;
        }
        if (NAN(dVar1)) {
          bVar3 = false;
        }
        dVar5 = dVar5 + dVar1;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = dVar5;
        pdVar4 = pdVar4 + 1;
      } while (pdVar4 != pdVar2);
    }
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = auVar6._0_8_ + -1.0;
    auVar7 = vandpd_avx(auVar7,auVar8);
    if (1e-12 < auVar7._0_8_) {
      bVar3 = false;
    }
    auVar6 = vandpd_avx(auVar6,auVar8);
    if (auVar6._0_8_ < 1e-12) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Warning, initial state distribution was not set, assuming uniform...",0x44);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      SetUniformISD(this);
      bVar3 = true;
    }
    if (((long)(this->_m_initialStateDistribution->super_SDV).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)(this->_m_initialStateDistribution->super_SDV).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start >> 3 == this->_m_nrStates) && (bVar3)) goto LAB_0047ae05;
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,
         "MADPComponentDiscreteStates::SetInitialized initial state distribution is not a valid probability distribution"
        );
  }
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

bool MADPComponentDiscreteStates::SetInitialized(bool b)
{
    if(b)
    {
        if(_m_nrStates==0)
            throw(E("MADPComponentDiscreteStates::SetInitialized problem has 0 states"));

        // alike to Belief::SanityCheck()

        bool validISD=true;

        // check for negative and entries>1
        double sum=0;
        for(vector<double>::const_iterator it=
                _m_initialStateDistribution->begin();
            it!=_m_initialStateDistribution->end(); ++it)
        {
            if(*it<0)
                validISD=false;
            if(*it>1)
                validISD=false;
            if(std::isnan(*it))
                validISD=false;
            sum+=*it;
        }

        // check if sums to 1
        if(abs(sum-1)>PROB_PRECISION)
            validISD=false;

        // but if it sums to 0, this means the ISD simply has not been set.
        // in this case, we set to uniform:
        if(abs(sum) < PROB_PRECISION)
        {
            cerr << "Warning, initial state distribution was not set, assuming uniform..." << endl;
            this->SetUniformISD();
            validISD = true;
        }

        // check whether the size is correct
        if(_m_initialStateDistribution->size()!=_m_nrStates)
            validISD=false;
        
        if(!validISD)
            throw(E("MADPComponentDiscreteStates::SetInitialized initial state distribution is not a valid probability distribution"));
    }

    _m_initialized = b;
    return(b);
}